

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O0

void __thiscall
Diligent::FixedBlockMemoryAllocator::MemoryPage::MemoryPage
          (MemoryPage *this,FixedBlockMemoryAllocator *OwnerAllocator)

{
  int iVar1;
  Char *Message;
  undefined4 extraout_var;
  undefined1 local_40 [8];
  string msg;
  size_t PageSize;
  FixedBlockMemoryAllocator *OwnerAllocator_local;
  MemoryPage *this_local;
  
  this->m_NumFreeBlocks = OwnerAllocator->m_NumBlocksInPage;
  this->m_NumInitializedBlocks = 0;
  this->m_pPageStart = (void *)0x0;
  this->m_pNextFreeBlock = (void *)0x0;
  this->m_pOwnerAllocator = OwnerAllocator;
  msg.field_2._8_8_ = OwnerAllocator->m_BlockSize * (long)(ulong)OwnerAllocator->m_NumBlocksInPage;
  if (msg.field_2._8_8_ == 0) {
    FormatString<char[26],char[13]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"PageSize > 0",(char (*) [13])(ulong)OwnerAllocator->m_NumBlocksInPage
              );
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"MemoryPage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0x35);
    std::__cxx11::string::~string((string *)local_40);
  }
  iVar1 = (**OwnerAllocator->m_RawMemoryAllocator->_vptr_IMemoryAllocator)
                    (OwnerAllocator->m_RawMemoryAllocator,msg.field_2._8_8_,
                     "FixedBlockMemoryAllocator page",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
                     ,0x37);
  this->m_pPageStart = (void *)CONCAT44(extraout_var,iVar1);
  this->m_pNextFreeBlock = this->m_pPageStart;
  FillWithDebugPattern(this->m_pPageStart,0xaa,msg.field_2._8_8_);
  return;
}

Assistant:

FixedBlockMemoryAllocator::MemoryPage::MemoryPage(FixedBlockMemoryAllocator& OwnerAllocator) :
    // clang-format off
    m_NumFreeBlocks       {OwnerAllocator.m_NumBlocksInPage},
    m_NumInitializedBlocks{0},
    m_pOwnerAllocator     {&OwnerAllocator}
// clang-format on
{
    const auto PageSize = OwnerAllocator.m_BlockSize * OwnerAllocator.m_NumBlocksInPage;
    VERIFY_EXPR(PageSize > 0);
    m_pPageStart = reinterpret_cast<Uint8*>(
        OwnerAllocator.m_RawMemoryAllocator.Allocate(PageSize, "FixedBlockMemoryAllocator page", __FILE__, __LINE__));
    m_pNextFreeBlock = m_pPageStart;
    FillWithDebugPattern(m_pPageStart, NewPageMemPattern, PageSize);
}